

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O0

void jcopy_markers_execute(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JCOPY_OPTION option)

{
  int in_EDX;
  j_compress_ptr in_RSI;
  long in_RDI;
  jpeg_saved_marker_ptr_conflict marker;
  uint in_stack_ffffffffffffffdc;
  JOCTET *dataptr;
  
  for (dataptr = *(JOCTET **)(in_RDI + 400); dataptr != (JOCTET *)0x0; dataptr = *(JOCTET **)dataptr
      ) {
    if (((((in_RSI->write_JFIF_header == 0) || (dataptr[8] != 0xe0)) ||
         (*(uint *)(dataptr + 0x10) < 5)) ||
        (((**(char **)(dataptr + 0x18) != 'J' || (*(char *)(*(long *)(dataptr + 0x18) + 1) != 'F'))
         || ((*(char *)(*(long *)(dataptr + 0x18) + 2) != 'I' ||
             ((*(char *)(*(long *)(dataptr + 0x18) + 3) != 'F' ||
              (*(char *)(*(long *)(dataptr + 0x18) + 4) != '\0')))))))) &&
       ((in_RSI->write_Adobe_marker == 0 ||
        (((((dataptr[8] != 0xee || (*(uint *)(dataptr + 0x10) < 5)) ||
           (**(char **)(dataptr + 0x18) != 'A')) ||
          ((*(char *)(*(long *)(dataptr + 0x18) + 1) != 'd' ||
           (*(char *)(*(long *)(dataptr + 0x18) + 2) != 'o')))) ||
         ((*(char *)(*(long *)(dataptr + 0x18) + 3) != 'b' ||
          (*(char *)(*(long *)(dataptr + 0x18) + 4) != 'e')))))))) {
      jpeg_write_marker(in_RSI,in_EDX,dataptr,in_stack_ffffffffffffffdc);
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jcopy_markers_execute(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
                      JCOPY_OPTION option)
{
  jpeg_saved_marker_ptr marker;

  /* In the current implementation, we don't actually need to examine the
   * option flag here; we just copy everything that got saved.
   * But to avoid confusion, we do not output JFIF and Adobe APP14 markers
   * if the encoder library already wrote one.
   */
  for (marker = srcinfo->marker_list; marker != NULL; marker = marker->next) {
    if (dstinfo->write_JFIF_header &&
        marker->marker == JPEG_APP0 &&
        marker->data_length >= 5 &&
        marker->data[0] == 0x4A &&
        marker->data[1] == 0x46 &&
        marker->data[2] == 0x49 &&
        marker->data[3] == 0x46 &&
        marker->data[4] == 0)
      continue;                 /* reject duplicate JFIF */
    if (dstinfo->write_Adobe_marker &&
        marker->marker == JPEG_APP0 + 14 &&
        marker->data_length >= 5 &&
        marker->data[0] == 0x41 &&
        marker->data[1] == 0x64 &&
        marker->data[2] == 0x6F &&
        marker->data[3] == 0x62 &&
        marker->data[4] == 0x65)
      continue;                 /* reject duplicate Adobe */
    jpeg_write_marker(dstinfo, marker->marker,
                      marker->data, marker->data_length);
  }
}